

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O0

deUint8 __thiscall
deqp::gles31::Functional::anon_unknown_1::LineRenderCase::checkLineWidths
          (LineRenderCase *this,ConstPixelBufferAccess *access,IVec2 *begin,IVec2 *end,
          int componentNdx,int *messageLimitCounter)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  RenderTarget *this_00;
  int *piVar6;
  bool local_119;
  bool local_10d;
  int local_d4;
  undefined1 local_c0 [6];
  bool incorrectRelaxedLineWidth_1;
  bool incorrectLineWidth_1;
  Vector<int,_2> local_b0;
  IVec2 cursor_2;
  bool incorrectRelaxedLineWidth;
  bool incorrectLineWidth;
  bool hit;
  IVec2 cursor_1;
  Vector<int,_2> local_78;
  IVec2 cursor;
  Vector<int,_2> local_60;
  IVec2 advance;
  deUint8 errorMask;
  bool bboxLimitedLine;
  int lineWidth;
  IVec2 relaxedLineWidthRange;
  IVec2 lineWidthRange;
  int lineRenderWidth;
  bool multisample;
  int *messageLimitCounter_local;
  int componentNdx_local;
  IVec2 *end_local;
  IVec2 *begin_local;
  ConstPixelBufferAccess *access_local;
  LineRenderCase *this_local;
  
  this_00 = gles31::Context::getRenderTarget((this->super_BBoxRenderCase).super_TestCase.m_context);
  iVar2 = tcu::RenderTarget::getNumSamples(this_00);
  if ((this->m_isWideLineCase & 1U) == 0) {
    local_d4 = 1;
  }
  else {
    local_d4 = this->m_wideLineLineWidth;
  }
  if (iVar2 < 2) {
    tcu::Vector<int,_2>::Vector(&relaxedLineWidthRange,local_d4,local_d4);
  }
  else {
    tcu::Vector<int,_2>::Vector(&relaxedLineWidthRange,local_d4,local_d4 + 1);
  }
  tcu::Vector<int,_2>::Vector((Vector<int,_2> *)&stack0xffffffffffffffb0,local_d4 + -1,local_d4 + 1)
  ;
  advance.m_data[1] = 0;
  advance.m_data[0]._3_1_ = 0;
  advance.m_data[0]._2_1_ = 0;
  iVar2 = tcu::Vector<int,_2>::x(begin);
  iVar3 = tcu::Vector<int,_2>::x(end);
  if (iVar2 == iVar3) {
    tcu::Vector<int,_2>::Vector(&local_60,0,1);
  }
  else {
    tcu::Vector<int,_2>::Vector(&local_60,1,0);
  }
  iVar2 = tcu::Vector<int,_2>::x(begin);
  iVar3 = tcu::Vector<int,_2>::y(begin);
  iVar4 = (int)access;
  tcu::ConstPixelBufferAccess::getPixelInt((ConstPixelBufferAccess *)&cursor,iVar4,iVar2,iVar3);
  piVar6 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)&cursor,componentNdx);
  if (*piVar6 != 0) {
    advance.m_data[0]._3_1_ = 1;
    tcu::operator-((tcu *)&local_78,begin,&local_60);
    while ((piVar6 = tcu::Vector<int,_2>::x(&local_78), -1 < *piVar6 &&
           (piVar6 = tcu::Vector<int,_2>::y(&local_78), -1 < *piVar6))) {
      piVar6 = tcu::Vector<int,_2>::x(&local_78);
      iVar2 = *piVar6;
      piVar6 = tcu::Vector<int,_2>::y(&local_78);
      tcu::ConstPixelBufferAccess::getPixelInt
                ((ConstPixelBufferAccess *)&cursor_1,iVar4,iVar2,*piVar6);
      piVar6 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)&cursor_1,componentNdx);
      if (*piVar6 == 0) break;
      advance.m_data[1] = advance.m_data[1] + 1;
      tcu::Vector<int,_2>::operator-=(&local_78,&local_60);
    }
  }
  tcu::Vector<int,_2>::Vector((Vector<int,_2> *)&stack0xffffffffffffff70,begin);
  while (bVar1 = tcu::Vector<int,_2>::operator!=((Vector<int,_2> *)&stack0xffffffffffffff70,end),
        bVar1) {
    piVar6 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&stack0xffffffffffffff70);
    iVar2 = *piVar6;
    piVar6 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&stack0xffffffffffffff70);
    tcu::ConstPixelBufferAccess::getPixelInt
              ((ConstPixelBufferAccess *)(cursor_2.m_data + 1),iVar4,iVar2,*piVar6);
    piVar6 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)(cursor_2.m_data + 1),componentNdx);
    iVar2 = advance.m_data[1];
    if (*piVar6 == 0) {
      if (advance.m_data[1] != 0) {
        iVar5 = tcu::Vector<int,_2>::x(&relaxedLineWidthRange);
        iVar3 = advance.m_data[1];
        if ((iVar5 <= iVar2) || (local_10d = true, (advance.m_data[0]._3_1_ & 1) != 0)) {
          iVar2 = tcu::Vector<int,_2>::y(&relaxedLineWidthRange);
          local_10d = iVar2 < iVar3;
        }
        iVar2 = advance.m_data[1];
        cursor_2.m_data[0]._3_1_ = local_10d;
        if (local_10d != false) {
          iVar5 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&stack0xffffffffffffffb0);
          iVar3 = advance.m_data[1];
          if ((iVar5 <= iVar2) || (local_119 = true, (advance.m_data[0]._3_1_ & 1) != 0)) {
            iVar2 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&stack0xffffffffffffffb0);
            local_119 = iVar2 < iVar3;
          }
          iVar2 = advance.m_data[1];
          cursor_2.m_data[0]._2_1_ = local_119;
          if (local_119 == false) {
            advance.m_data[0]._2_1_ = advance.m_data[0]._2_1_ | 4;
          }
          else {
            advance.m_data[0]._2_1_ = advance.m_data[0]._2_1_ | 8;
          }
          iVar3 = tcu::Vector<int,_2>::x(&local_60);
          printLineWidthError(this,(IVec2 *)&stack0xffffffffffffff70,iVar2,&relaxedLineWidthRange,
                              iVar3 == 0,messageLimitCounter);
        }
        advance.m_data[1] = 0;
        advance.m_data[0]._3_1_ = 0;
      }
    }
    else {
      advance.m_data[1] = advance.m_data[1] + 1;
    }
    tcu::Vector<int,_2>::operator+=((Vector<int,_2> *)&stack0xffffffffffffff70,&local_60);
  }
  if (advance.m_data[1] != 0) {
    tcu::Vector<int,_2>::Vector(&local_b0,end);
    while( true ) {
      piVar6 = tcu::Vector<int,_2>::x(&local_b0);
      iVar2 = *piVar6;
      iVar3 = tcu::ConstPixelBufferAccess::getWidth(access);
      if (iVar3 <= iVar2) break;
      piVar6 = tcu::Vector<int,_2>::y(&local_b0);
      iVar2 = *piVar6;
      iVar3 = tcu::ConstPixelBufferAccess::getHeight(access);
      if (iVar3 <= iVar2) break;
      piVar6 = tcu::Vector<int,_2>::x(&local_b0);
      iVar2 = *piVar6;
      piVar6 = tcu::Vector<int,_2>::y(&local_b0);
      tcu::ConstPixelBufferAccess::getPixelInt
                ((ConstPixelBufferAccess *)local_c0,iVar4,iVar2,*piVar6);
      piVar6 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)local_c0,componentNdx);
      iVar2 = advance.m_data[1];
      if (*piVar6 == 0) {
        if (advance.m_data[1] != 0) {
          iVar5 = tcu::Vector<int,_2>::y(&relaxedLineWidthRange);
          iVar3 = advance.m_data[1];
          if (iVar5 < iVar2) {
            iVar5 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&stack0xffffffffffffffb0);
            iVar2 = advance.m_data[1];
            if (iVar5 < iVar3) {
              advance.m_data[0]._2_1_ = advance.m_data[0]._2_1_ | 8;
            }
            else {
              advance.m_data[0]._2_1_ = advance.m_data[0]._2_1_ | 4;
            }
            iVar3 = tcu::Vector<int,_2>::x(&local_60);
            printLineWidthError(this,&local_b0,iVar2,&relaxedLineWidthRange,iVar3 == 0,
                                messageLimitCounter);
          }
          advance.m_data[1] = 0;
        }
      }
      else {
        advance.m_data[1] = advance.m_data[1] + 1;
      }
      tcu::Vector<int,_2>::operator+=(&local_b0,&local_60);
    }
    iVar2 = advance.m_data[1];
    iVar4 = tcu::Vector<int,_2>::y(&relaxedLineWidthRange);
    iVar3 = advance.m_data[1];
    if (iVar4 < iVar2) {
      iVar4 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&stack0xffffffffffffffb0);
      iVar2 = advance.m_data[1];
      if (iVar4 < iVar3) {
        advance.m_data[0]._2_1_ = advance.m_data[0]._2_1_ | 8;
      }
      else {
        advance.m_data[0]._2_1_ = advance.m_data[0]._2_1_ | 4;
      }
      iVar3 = tcu::Vector<int,_2>::x(&local_60);
      printLineWidthError(this,&local_b0,iVar2,&relaxedLineWidthRange,iVar3 == 0,messageLimitCounter
                         );
    }
  }
  return advance.m_data[0]._2_1_;
}

Assistant:

deUint8 LineRenderCase::checkLineWidths (const tcu::ConstPixelBufferAccess& access, const tcu::IVec2& begin, const tcu::IVec2& end, int componentNdx, int& messageLimitCounter) const
{
	const bool			multisample				= m_context.getRenderTarget().getNumSamples() > 1;
	const int			lineRenderWidth			= (m_isWideLineCase) ? (m_wideLineLineWidth) : 1;
	const tcu::IVec2	lineWidthRange			= (multisample)
													? (tcu::IVec2(lineRenderWidth, lineRenderWidth+1))	// multisampled "smooth" lines may spread to neighboring pixel
													: (tcu::IVec2(lineRenderWidth, lineRenderWidth));
	const tcu::IVec2	relaxedLineWidthRange	= (tcu::IVec2(lineRenderWidth-1, lineRenderWidth+1));

	int					lineWidth				= 0;
	bool				bboxLimitedLine			= false;
	deUint8				errorMask				= 0;

	const tcu::IVec2	advance					= (begin.x() == end.x()) ? (tcu::IVec2(0, 1)) : (tcu::IVec2(1, 0));

	// fragments before begin?
	if (access.getPixelInt(begin.x(), begin.y())[componentNdx] != 0)
	{
		bboxLimitedLine = true;

		for (tcu::IVec2 cursor = begin - advance;; cursor -= advance)
		{
			if (cursor.x() < 0 || cursor.y() < 0)
			{
				break;
			}
			else if (access.getPixelInt(cursor.x(), cursor.y())[componentNdx] != 0)
			{
				++lineWidth;
			}
			else
				break;
		}
	}

	for (tcu::IVec2 cursor = begin; cursor != end; cursor += advance)
	{
		const bool hit = (access.getPixelInt(cursor.x(), cursor.y())[componentNdx] != 0);

		if (hit)
			++lineWidth;
		else if (lineWidth)
		{
			// Line is allowed to be be thinner if it borders the bbox boundary (since part of the line might have been discarded).
			const bool incorrectLineWidth = (lineWidth < lineWidthRange.x() && !bboxLimitedLine) || (lineWidth > lineWidthRange.y());

			if (incorrectLineWidth)
			{
				const bool incorrectRelaxedLineWidth = (lineWidth < relaxedLineWidthRange.x() && !bboxLimitedLine) || (lineWidth > relaxedLineWidthRange.y());

				if (incorrectRelaxedLineWidth)
					errorMask |= SCANRESULT_LINE_WIDTH_ERR_BIT;
				else
					errorMask |= SCANRESULT_LINE_WIDTH_WARN_BIT;

				printLineWidthError(cursor, lineWidth, lineWidthRange, advance.x() == 0, messageLimitCounter);
			}

			lineWidth = 0;
			bboxLimitedLine = false;
		}
	}

	// fragments after end?
	if (lineWidth)
	{
		for (tcu::IVec2 cursor = end;; cursor += advance)
		{
			if (cursor.x() >= access.getWidth() || cursor.y() >= access.getHeight())
			{
				if (lineWidth > lineWidthRange.y())
				{
					if (lineWidth > relaxedLineWidthRange.y())
						errorMask |= SCANRESULT_LINE_WIDTH_ERR_BIT;
					else
						errorMask |= SCANRESULT_LINE_WIDTH_WARN_BIT;

					printLineWidthError(cursor, lineWidth, lineWidthRange, advance.x() == 0, messageLimitCounter);
				}

				break;
			}
			else if (access.getPixelInt(cursor.x(), cursor.y())[componentNdx] != 0)
			{
				++lineWidth;
			}
			else if (lineWidth)
			{
				// only check that line width is not larger than expected. Line width may be smaller
				// since the scanning 'cursor' is now outside the bounding box.
				const bool incorrectLineWidth = (lineWidth > lineWidthRange.y());

				if (incorrectLineWidth)
				{
					const bool incorrectRelaxedLineWidth = (lineWidth > relaxedLineWidthRange.y());

					if (incorrectRelaxedLineWidth)
						errorMask |= SCANRESULT_LINE_WIDTH_ERR_BIT;
					else
						errorMask |= SCANRESULT_LINE_WIDTH_WARN_BIT;

					printLineWidthError(cursor, lineWidth, lineWidthRange, advance.x() == 0, messageLimitCounter);
				}

				lineWidth = 0;
			}
		}
	}

	return errorMask;
}